

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O0

int has_toplevel_function(char *rtype,char *sig)

{
  int iVar1;
  Fl_Class_Type *pFVar2;
  undefined4 extraout_var;
  Fl_Function_Type *fn;
  Fl_Type *child;
  char *sig_local;
  char *rtype_local;
  
  fn = (Fl_Function_Type *)Fl_Type::first;
  do {
    if (fn == (Fl_Function_Type *)0x0) {
      return 0;
    }
    pFVar2 = Fl_Type::is_in_class(&fn->super_Fl_Type);
    if (pFVar2 == (Fl_Class_Type *)0x0) {
      iVar1 = (*(fn->super_Fl_Type)._vptr_Fl_Type[5])();
      iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"Function");
      if ((iVar1 == 0) && (iVar1 = Fl_Function_Type::has_signature(fn,rtype,sig), iVar1 != 0)) {
        return 1;
      }
    }
    fn = (Fl_Function_Type *)(fn->super_Fl_Type).next;
  } while( true );
}

Assistant:

int has_toplevel_function(const char *rtype, const char *sig) {
  Fl_Type *child;
  for (child = Fl_Type::first; child; child = child->next) {
    if (!child->is_in_class() && strcmp(child->type_name(), "Function")==0) {
      const Fl_Function_Type *fn = (const Fl_Function_Type*)child;
      if (fn->has_signature(rtype, sig))
        return 1;
    }
  }
  return 0;
}